

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall PeleLM::state_stats(PeleLM *this,MultiFab *S)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  Print *pPVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  initializer_list<const_amrex::MultiFab_*> __l;
  initializer_list<const_amrex::MultiFab_*> __l_00;
  allocator_type local_209;
  Vector<double,_std::allocator<double>_> scaleMin;
  Vector<double,_std::allocator<double>_> scaleMax;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  Print local_1b8;
  
  if (1 < NavierStokesBase::verbose) {
    __l._M_len = 1;
    __l._M_array = (iterator)&scaleMax;
    scaleMax.super_vector<double,_std::allocator<double>_>.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)S;
    std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
              ((vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               &local_1b8,__l,(allocator_type *)&names);
    amrex::VectorMin(&scaleMin,
                     (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                     &local_1b8,(IntVect *)&amrex::FabArrayBase::mfiter_tile_size,3,
                     NavierStokesBase::NUM_STATE + -3,0);
    std::_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
    ~_Vector_base((_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *
                  )&local_1b8);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&names;
    names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)S;
    std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
              ((vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               &local_1b8,__l_00,&local_209);
    amrex::VectorMax(&scaleMax,
                     (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                     &local_1b8,(IntVect *)&amrex::FabArrayBase::mfiter_tile_size,3,
                     NavierStokesBase::NUM_STATE + -3,0);
    std::_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
    ~_Vector_base((_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *
                  )&local_1b8);
    uVar6 = 0;
    bVar2 = false;
    while ((uVar6 < 9 && (!bVar2))) {
      lVar7 = uVar6 - 3;
      uVar6 = uVar6 + 1;
      bVar2 = scaleMin.super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[first_spec + lVar7] <= 0.0 &&
              scaleMin.super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[first_spec + lVar7] != 0.0;
    }
    poVar4 = amrex::OutStream();
    amrex::Print::Print(&local_1b8,poVar4);
    std::operator<<((ostream *)&local_1b8.ss,"      |-> Min,max temp = ");
    pPVar5 = amrex::Print::operator<<
                       (&local_1b8,
                        scaleMin.super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + (long)NavierStokesBase::Temp + -3);
    std::operator<<((ostream *)&pPVar5->ss,", ");
    pPVar5 = amrex::Print::operator<<
                       (pPVar5,scaleMax.super_vector<double,_std::allocator<double>_>.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + (long)NavierStokesBase::Temp + -3)
    ;
    std::operator<<((ostream *)&pPVar5->ss,'\n');
    amrex::Print::~Print(&local_1b8);
    poVar4 = amrex::OutStream();
    amrex::Print::Print(&local_1b8,poVar4);
    std::operator<<((ostream *)&local_1b8.ss,"      |-> Min,max rho  = ");
    pPVar5 = amrex::Print::operator<<
                       (&local_1b8,
                        scaleMin.super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
    std::operator<<((ostream *)&pPVar5->ss,", ");
    pPVar5 = amrex::Print::operator<<
                       (pPVar5,scaleMax.super_vector<double,_std::allocator<double>_>.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start);
    std::operator<<((ostream *)&pPVar5->ss,'\n');
    amrex::Print::~Print(&local_1b8);
    poVar4 = amrex::OutStream();
    amrex::Print::Print(&local_1b8,poVar4);
    std::operator<<((ostream *)&local_1b8.ss,"      |-> Min,max rhoh = ");
    pPVar5 = amrex::Print::operator<<
                       (&local_1b8,
                        scaleMin.super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + (long)RhoH + -3);
    std::operator<<((ostream *)&pPVar5->ss,", ");
    pPVar5 = amrex::Print::operator<<
                       (pPVar5,scaleMax.super_vector<double,_std::allocator<double>_>.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + (long)RhoH + -3);
    std::operator<<((ostream *)&pPVar5->ss,'\n');
    amrex::Print::~Print(&local_1b8);
    if (bVar2) {
      names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pele::physics::eos::speciesNames<pele::physics::eos::Fuego>(&names);
      poVar4 = amrex::OutStream();
      amrex::Print::Print(&local_1b8,poVar4);
      std::operator<<((ostream *)&local_1b8.ss,"  Species w/min < 0: ");
      amrex::Print::~Print(&local_1b8);
      iVar8 = -3;
      poVar1 = &local_1b8.ss;
      for (lVar7 = 0; lVar7 != 0x120; lVar7 = lVar7 + 0x20) {
        iVar3 = first_spec + iVar8;
        if (scaleMin.super_vector<double,_std::allocator<double>_>.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar3] <= 0.0 &&
            scaleMin.super_vector<double,_std::allocator<double>_>.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar3] != 0.0) {
          poVar4 = amrex::OutStream();
          amrex::Print::Print(&local_1b8,poVar4);
          std::operator<<((ostream *)poVar1,"Y(");
          std::operator<<((ostream *)poVar1,
                          (string *)
                          ((long)&((names.
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar7));
          std::operator<<((ostream *)poVar1,") [");
          pPVar5 = amrex::Print::operator<<
                             (&local_1b8,
                              scaleMin.super_vector<double,_std::allocator<double>_>.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + iVar3);
          std::operator<<((ostream *)&pPVar5->ss,"]  ");
          amrex::Print::~Print(&local_1b8);
        }
        iVar8 = iVar8 + 1;
      }
      poVar4 = amrex::OutStream();
      amrex::Print::Print(&local_1b8,poVar4);
      std::operator<<((ostream *)&local_1b8.ss,'\n');
      amrex::Print::~Print(&local_1b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&names.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&scaleMax);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&scaleMin);
  }
  return;
}

Assistant:

void
PeleLM::state_stats (MultiFab& S)
{
   BL_PROFILE("PLM::state_stats()");
   if (verbose > 1) {
      //
      // Calculate some minimums and maximums.
      //
      auto scaleMin = VectorMin({&S},FabArrayBase::mfiter_tile_size,Density,NUM_STATE-AMREX_SPACEDIM,0);
      auto scaleMax = VectorMax({&S},FabArrayBase::mfiter_tile_size,Density,NUM_STATE-AMREX_SPACEDIM,0);

      bool aNegY = false;
      for (int i = 0; i < NUM_SPECIES && !aNegY; ++i) {
         if (scaleMin[first_spec+i-AMREX_SPACEDIM] < 0) aNegY = true;
      }

      amrex::Print() << "      |-> Min,max temp = " << scaleMin[Temp   - AMREX_SPACEDIM]
                     << ", "                << scaleMax[Temp   - AMREX_SPACEDIM] << '\n';
      amrex::Print() << "      |-> Min,max rho  = " << scaleMin[Density- AMREX_SPACEDIM]
                     << ", "                << scaleMax[Density- AMREX_SPACEDIM] << '\n';
      amrex::Print() << "      |-> Min,max rhoh = " << scaleMin[RhoH   - AMREX_SPACEDIM]
                     << ", "                << scaleMax[RhoH   - AMREX_SPACEDIM] << '\n';

      if (aNegY){
         Vector<std::string> names;
         pele::physics::eos::speciesNames<pele::physics::PhysicsType::eos_type>(names);
         amrex::Print() << "  Species w/min < 0: ";
         for (int i = 0; i < NUM_SPECIES; ++i) {
            int idx = first_spec + i - AMREX_SPACEDIM;
            if ( scaleMin[idx] < 0) {
               amrex::Print() << "Y(" << names[i] << ") [" << scaleMin[idx] << "]  ";
            }
         }
         amrex::Print() << '\n';
      }
   }
}